

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::Transfer_Control_Request_PDU
          (Transfer_Control_Request_PDU *this)

{
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transfer_Control_Request_PDU_00215a30;
  this->m_ui32ReqID = 0;
  this->m_ui8ReqRelSrv = '\0';
  this->m_ui8TrnTyp = '\0';
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TrnsEntID);
  this->m_ui32NumRecSets = 0;
  (this->m_vRecs).
  super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vRecs).
  super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vRecs).
  super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '#';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  return;
}

Assistant:

Transfer_Control_Request_PDU::Transfer_Control_Request_PDU() :
    m_ui32ReqID( 0 ),
    m_ui8ReqRelSrv( 0 ),
    m_ui8TrnTyp( 0 ),
    m_ui32NumRecSets( 0 )
{
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = TransferControl_PDU_Type;
    m_ui16PDULength = TRANSFER_CONTROL_REQUEST_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}